

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetic.h
# Opt level: O1

int __thiscall FastPForLib::ZipfianGenerator::init(ZipfianGenerator *this,EVP_PKEY_CTX *ctx)

{
  double *pdVar1;
  long lVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  double *pdVar5;
  double *extraout_RAX;
  runtime_error *this_00;
  uint32_t uVar6;
  double *pdVar7;
  long lVar8;
  double in_XMM0_Qa;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 in_ZMM3 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  value_type local_20;
  
  uVar6 = (uint32_t)ctx;
  this->n = uVar6;
  if (uVar6 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"no items?");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->theta = in_XMM0_Qa;
  dVar11 = 0.0;
  if (in_XMM0_Qa <= 0.0) {
    auVar4 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,uVar6);
    local_20 = 1.0 / auVar4._0_8_;
    std::vector<double,_std::allocator<double>_>::resize
              (&this->proba,(ulong)ctx & 0xffffffff,&local_20);
    pdVar5 = extraout_RAX;
  }
  else {
    if (0 < (int)uVar6) {
      lVar8 = 1;
      dVar11 = 0.0;
      do {
        dVar9 = pow((double)lVar8,in_XMM0_Qa);
        dVar11 = dVar11 + 1.0 / dVar9;
        lVar2 = (1 - (long)(int)uVar6) + lVar8;
        lVar8 = lVar8 + 1;
      } while (lVar2 != 1);
    }
    this->zetan = 1.0 / dVar11;
    pdVar3 = (this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar3) {
      (this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar3;
    }
    local_20 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize(&this->proba,(ulong)this->n,&local_20);
    pdVar5 = (this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pdVar5 = this->zetan;
    if (1 < this->n) {
      pdVar7 = (double *)0x1;
      do {
        dVar11 = (this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pdVar7 - 1];
        pdVar1 = (double *)((long)pdVar7 + 1);
        auVar4._8_8_ = in_XMM4_Qb;
        auVar4._0_8_ = in_XMM4_Qa;
        auVar4 = vcvtusi2sd_avx512f(auVar4,(int)pdVar1);
        dVar9 = this->zetan;
        dVar10 = pow(auVar4._0_8_,this->theta);
        (this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[(long)pdVar7] = dVar9 / dVar10 + dVar11;
        pdVar5 = (double *)(ulong)this->n;
        pdVar7 = pdVar1;
      } while (pdVar1 < pdVar5);
    }
  }
  return (int)pdVar5;
}

Assistant:

void init(int _items, double _zipfianconstant = 1.0) {
    n = _items;
    if (_items == 0)
      throw std::runtime_error("no items?");
    theta = _zipfianconstant;
    if (theta > 0) {
      zetan = 1 / zeta(n, theta);
      proba.clear();
      proba.resize(n, 0);
      proba[0] = zetan;
      for (uint32_t i = 1; i < n; ++i)
        proba[i] = proba[i - 1] + zetan / pow(i + 1, theta);
    } else {
      proba.resize(n, 1.0 / n);
    }
  }